

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_conv_2d_dw(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long in_RSI;
  ggml_conv_2d_dw_params p;
  ggml_tensor *src;
  ggml_tensor *kernel;
  ggml_conv_2d_dw_params *in_stack_00000148;
  ggml_tensor *in_stack_00000150;
  ggml_tensor *in_stack_00000158;
  ggml_tensor *in_stack_00000160;
  ggml_compute_params *in_stack_00000168;
  ggml_conv_2d_dw_params *p_00;
  ggml_tensor *dst_00;
  ggml_tensor *kernel_00;
  ggml_tensor *src_00;
  ggml_compute_params *params_00;
  
  lVar1 = *(long *)(in_RSI + 0x98);
  lVar2 = *(long *)(in_RSI + 0xa0);
  p_00 = *(ggml_conv_2d_dw_params **)(lVar2 + 0x20);
  dst_00 = *(ggml_tensor **)(lVar2 + 0x28);
  kernel_00 = *(ggml_tensor **)(lVar2 + 0x10);
  src_00 = *(ggml_tensor **)(lVar2 + 0x18);
  params_00 = *(ggml_compute_params **)(in_RSI + 0x10);
  if (*(ggml_conv_2d_dw_params **)(lVar1 + 0x28) != p_00) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1851,"GGML_ASSERT(%s) failed","kernel->ne[3] == p.channels");
  }
  if (*(ggml_tensor **)(in_RSI + 0x28) != dst_00) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1852,"GGML_ASSERT(%s) failed","dst->ne[3] == p.batch");
  }
  uVar3 = ggml_is_contiguous(lVar2);
  if ((uVar3 & 1) == 0) {
    uVar3 = ggml_is_contiguous_channels(lVar2);
    if ((uVar3 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x185b,"non-contiguous memory layout not supported");
    }
    else {
      if ((*(ulong *)(lVar1 + 0x30) < *(ulong *)(lVar1 + 0x40)) ||
         (*(ulong *)(lVar1 + 0x38) < *(ulong *)(lVar1 + 0x30))) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                   ,0x1858,"GGML_ASSERT(%s) failed",
                   "kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]");
      }
      ggml_compute_forward_conv_2d_dw_cwhn
                (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000150,
                 in_stack_00000148);
    }
  }
  else {
    ggml_compute_forward_conv_2d_dw_whcn(params_00,src_00,kernel_00,dst_00,p_00);
  }
  return;
}

Assistant:

void ggml_compute_forward_conv_2d_dw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * kernel = dst->src[0];
    const ggml_tensor * src = dst->src[1];
    ggml_conv_2d_dw_params p;
    p.channels = src->ne[2];
    p.batch = src->ne[3];
    p.src_w = src->ne[0];
    p.src_h = src->ne[1];
    p.dst_w = dst->ne[0];
    p.dst_h = dst->ne[1];
    p.knl_w = kernel->ne[0];
    p.knl_h = kernel->ne[1];
    p.stride_x = dst->op_params[0];
    p.stride_y = dst->op_params[1];
    p.pad_x = dst->op_params[2];
    p.pad_y = dst->op_params[3];
    p.dilation_x = dst->op_params[4];
    p.dilation_y = dst->op_params[5];

    GGML_ASSERT(kernel->ne[3] == p.channels);
    GGML_ASSERT(dst->ne[3] == p.batch);

    if (ggml_is_contiguous(src)) {
        ggml_compute_forward_conv_2d_dw_whcn(params, src, kernel, dst, p);
    } else if (ggml_is_contiguous_channels(src)) {
        // kernel should also have channels most contiguous in memory
        GGML_ASSERT(kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]);
        ggml_compute_forward_conv_2d_dw_cwhn(params, src, kernel, dst, p);
    } else {
        GGML_ABORT("non-contiguous memory layout not supported");
    }
}